

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  anon_struct_248_6_e7572c21_for_Dir *path;
  ConfigString *pCVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *container;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar2;
  cmGeneratorTarget *pcVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  PolicyStatus PVar10;
  uint uVar11;
  string *psVar12;
  cmState *pcVar13;
  cmValue cVar14;
  string *psVar15;
  string *psVar16;
  iterator __first;
  char *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *depName;
  ulong uVar17;
  size_type ii;
  long lVar18;
  long lVar19;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view value_00;
  string_view value_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view suffix;
  string_view suffix_00;
  unsigned_long iVerb;
  size_t local_c0;
  unsigned_long propInt;
  string *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  allocator<char> local_81;
  string relativeBuildDir;
  cmList filterList;
  
  iVar8 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x28])();
  this->MultiConfig = SUB41(iVar8,0);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&relativeBuildDir,this->Makefile);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)&relativeBuildDir);
  std::__cxx11::string::~string((string *)&relativeBuildDir);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&relativeBuildDir,this->Makefile,IncludeEmptyConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->ConfigsList,&relativeBuildDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&relativeBuildDir);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iVerb,"CMAKE_AUTOGEN_VERBOSE",(allocator<char> *)&propInt);
  psVar12 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&iVerb);
  std::__cxx11::string::string((string *)&relativeBuildDir,(string *)psVar12);
  std::__cxx11::string::~string((string *)&iVerb);
  if (relativeBuildDir._M_string_length != 0) {
    iVerb = 0;
    bVar5 = cmStrToULong(&relativeBuildDir,&iVerb);
    if (bVar5) {
      uVar9 = (uint)iVerb;
    }
    else {
      value._M_str = extraout_RDX;
      value._M_len = (size_t)relativeBuildDir._M_dataplus._M_p;
      bVar5 = cmValue::IsOn((cmValue *)relativeBuildDir._M_string_length,value);
      if (!bVar5) goto LAB_002ac874;
      uVar9 = 1;
    }
    this->Verbosity = uVar9;
  }
LAB_002ac874:
  std::__cxx11::string::~string((string *)&relativeBuildDir);
  pcVar13 = cmMakefile::GetState(this->Makefile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&relativeBuildDir,"AUTOMOC_TARGETS_FOLDER",(allocator<char> *)&iVerb);
  cVar14 = cmState::GetGlobalProperty(pcVar13,&relativeBuildDir);
  std::__cxx11::string::~string((string *)&relativeBuildDir);
  if (cVar14.Value == (string *)0x0) {
    pcVar13 = cmMakefile::GetState(this->Makefile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&relativeBuildDir,"AUTOGEN_TARGETS_FOLDER",(allocator<char> *)&iVerb);
    cVar14 = cmState::GetGlobalProperty(pcVar13,&relativeBuildDir);
    std::__cxx11::string::~string((string *)&relativeBuildDir);
    if (cVar14.Value != (string *)0x0) goto LAB_002ac939;
    pcVar3 = this->GenTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&relativeBuildDir,"FOLDER",(allocator<char> *)&iVerb);
    cVar14 = cmGeneratorTarget::GetProperty(pcVar3,&relativeBuildDir);
    std::__cxx11::string::~string((string *)&relativeBuildDir);
    if (cVar14.Value != (string *)0x0) goto LAB_002ac939;
  }
  else {
LAB_002ac939:
    std::__cxx11::string::_M_assign((string *)&this->TargetsFolder);
  }
  PVar10 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0071,false);
  if (PVar10 - NEW < 3) {
    this->CMP0071Accept = true;
  }
  else if (PVar10 == WARN) {
    this->CMP0071Warn = true;
  }
  PVar10 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0100,false);
  if (PVar10 - NEW < 3) {
    this->CMP0100Accept = true;
  }
  else if (PVar10 == WARN) {
    this->CMP0100Warn = true;
  }
  relativeBuildDir._M_dataplus._M_p = (pointer)&relativeBuildDir.field_2;
  relativeBuildDir._M_string_length = 0;
  propInt = (unsigned_long)&local_98;
  local_a0 = (string *)0x0;
  relativeBuildDir.field_2._M_local_buf[0] = '\0';
  local_98._M_local_buf[0] = '\0';
  psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
  cmsys::SystemTools::CollapseFullPath((string *)&iVerb,(string *)&propInt,psVar12);
  std::__cxx11::string::~string((string *)&propInt);
  psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string_const&,char_const(&)[13]>
            ((string *)&propInt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iVerb,
             (char (*) [13])0x75ecbb,psVar12,(char (*) [13])"_autogen.dir");
  path = &this->Dir;
  std::__cxx11::string::operator=((string *)path,(string *)&propInt);
  std::__cxx11::string::~string((string *)&propInt);
  cmsys::SystemTools::ConvertToUnixSlashes(&path->Info);
  pcVar3 = this->GenTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&propInt,"AUTOGEN_BUILD_DIR",(allocator<char> *)&filterList);
  cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&propInt);
  psVar12 = &(this->Dir).Build;
  std::__cxx11::string::_M_assign((string *)psVar12);
  std::__cxx11::string::~string((string *)&propInt);
  if ((this->Dir).Build._M_string_length == 0) {
    filterList.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2f;
    psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[9]>
              ((string *)&propInt,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iVerb,
               (char *)&filterList,psVar15,(char (*) [9])0x72a945);
    std::__cxx11::string::operator=((string *)psVar12,(string *)&propInt);
    std::__cxx11::string::~string((string *)&propInt);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(psVar12);
  cmSystemTools::RelativePath((string *)&propInt,(string *)&iVerb,psVar12);
  std::__cxx11::string::operator=((string *)&(this->Dir).RelativeBuild,(string *)&propInt);
  std::__cxx11::string::~string((string *)&propInt);
  AddCleanFile(this,psVar12);
  psVar15 = &(this->Dir).Work;
  std::__cxx11::string::_M_assign((string *)psVar15);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar15);
  cmStrCat<std::__cxx11::string&,char_const(&)[9]>
            ((string *)&propInt,psVar12,(char (*) [9])0x721dc4);
  psVar12 = &(this->Dir).IncludeGenExp;
  prefix._M_str = (char *)propInt;
  prefix._M_len = (size_t)local_a0;
  ConfigFileNamesAndGenex
            (this,&(this->Dir).Include,psVar12,prefix,(string_view)(ZEXT816(0x7979c9) << 0x40));
  std::__cxx11::string::~string((string *)&propInt);
  std::__cxx11::string::~string((string *)&iVerb);
  bVar5 = (this->Moc).super_GenVarsT.Enabled;
  bVar6 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar5 | bVar6) & 1) == 0) {
LAB_002ad1c9:
    if ((this->Rcc).super_GenVarsT.Enabled == true) {
      bVar5 = InitRcc(this);
      if (!bVar5) goto LAB_002ad335;
    }
    if ((((this->Moc).super_GenVarsT.Enabled != false) ||
        (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) ||
       (((this->Rcc).super_GenVarsT.Enabled == true && (this->MultiConfig == true)))) {
      pcVar3 = this->GenTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&iVerb,"AUTOGEN_USE_SYSTEM_INCLUDE",(allocator<char> *)&filterList);
      propInt = (unsigned_long)cmGeneratorTarget::GetProperty(pcVar3,(string *)&iVerb);
      std::__cxx11::string::~string((string *)&iVerb);
      bVar5 = cmValue::IsSet((cmValue *)&propInt);
      if (bVar5) {
        bVar7 = cmValue::IsOn((cmValue *)&propInt);
        bVar5 = true;
        if (bVar7) {
          pcVar3 = this->GenTarget;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&iVerb,"CXX",(allocator<char> *)&filterList);
          cmGeneratorTarget::AddSystemIncludeDirectory(pcVar3,psVar12,(string *)&iVerb);
LAB_002ad2d5:
          std::__cxx11::string::~string((string *)&iVerb);
          goto LAB_002ad2df;
        }
      }
      else {
        PVar10 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0151,false);
        if (PVar10 - NEW < 3) {
          pcVar3 = this->GenTarget;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&iVerb,"CXX",(allocator<char> *)&filterList);
          cmGeneratorTarget::AddSystemIncludeDirectory(pcVar3,psVar12,(string *)&iVerb);
          goto LAB_002ad2d5;
        }
        if (PVar10 < NEW) {
          bVar5 = true;
          goto LAB_002ad2ea;
        }
LAB_002ad2df:
        bVar5 = false;
      }
LAB_002ad2ea:
      cmGeneratorTarget::AddIncludeDirectory(this->GenTarget,psVar12,bVar5);
    }
    bVar5 = InitScanFiles(this);
    if (bVar5) {
      if (((this->Moc).super_GenVarsT.Enabled != false) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        InitAutogenTarget(this);
      }
      bVar5 = true;
      if ((this->Rcc).super_GenVarsT.Enabled == true) {
        InitRccTargets(this);
      }
      goto LAB_002ad337;
    }
  }
  else {
    if (bVar5 == false) {
LAB_002acbc5:
      if ((bVar6 & 1) != 0) {
        bVar5 = InitUic(this);
        if (!bVar5) goto LAB_002ad335;
      }
      psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[9]>
                ((string *)&iVerb,psVar15,(char (*) [9])0x72a945);
      std::__cxx11::string::operator=((string *)&this->AutogenTarget,(string *)&iVerb);
      std::__cxx11::string::~string((string *)&iVerb);
      propInt = 0;
      pcVar3 = this->GenTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&iVerb,"AUTOGEN_PARALLEL",(allocator<char> *)&filterList);
      psVar15 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&iVerb);
      std::__cxx11::string::~string((string *)&iVerb);
      if (psVar15->_M_string_length == 0) {
LAB_002acc67:
        uVar17 = (ulong)(anonymous_namespace)::GetParallelCPUCount()::count;
        if ((anonymous_namespace)::GetParallelCPUCount()::count == 0) {
          cmsys::SystemInformation::SystemInformation((SystemInformation *)&iVerb);
          cmsys::SystemInformation::RunCPUCheck((SystemInformation *)&iVerb);
          uVar11 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)&iVerb);
          uVar9 = 0x40;
          if (uVar11 < 0x41) {
            uVar9 = uVar11;
          }
          (anonymous_namespace)::GetParallelCPUCount()::count = 1;
          if (uVar11 != 0) {
            (anonymous_namespace)::GetParallelCPUCount()::count = uVar9;
          }
          cmsys::SystemInformation::~SystemInformation((SystemInformation *)&iVerb);
          uVar17 = (ulong)(anonymous_namespace)::GetParallelCPUCount()::count;
        }
      }
      else {
        bVar5 = std::operator==(psVar15,"AUTO");
        if (bVar5) goto LAB_002acc67;
        bVar5 = cmStrToULong(psVar15,&propInt);
        uVar17 = propInt;
        if (!bVar5 || 0xfffffffe < propInt - 1) {
          pcVar2 = this->Makefile;
          psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
          cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[15],std::__cxx11::string_const&,char_const(&)[41]>
                    ((string *)&iVerb,(char (*) [19])"AUTOGEN_PARALLEL=\"",psVar15,
                     (char (*) [15])"\" for target \"",psVar16,
                     (char (*) [41])"\" is not valid. Using AUTOGEN_PARALLEL=1");
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&iVerb);
          std::__cxx11::string::~string((string *)&iVerb);
          uVar17 = 1;
        }
      }
      (this->AutogenTarget).Parallel = (uint)uVar17;
      cmStrCat<std::__cxx11::string&,char_const(&)[18]>
                ((string *)&iVerb,&path->Info,(char (*) [18])"/AutogenInfo.json");
      std::__cxx11::string::operator=((string *)&(this->AutogenTarget).InfoFile,(string *)&iVerb);
      std::__cxx11::string::~string((string *)&iVerb);
      cmStrCat<std::__cxx11::string&,char_const(&)[13]>
                ((string *)&iVerb,&path->Info,(char (*) [13])"/AutogenUsed");
      pCVar1 = &(this->AutogenTarget).SettingsFile;
      prefix_00._M_str = (char *)iVerb;
      prefix_00._M_len = local_c0;
      suffix._M_str = ".txt";
      suffix._M_len = 4;
      ConfigFileNames(this,pCVar1,prefix_00,suffix);
      std::__cxx11::string::~string((string *)&iVerb);
      ConfigFileClean(this,pCVar1);
      cmStrCat<std::__cxx11::string&,char_const(&)[12]>
                ((string *)&iVerb,&path->Info,(char (*) [12])"/ParseCache");
      pCVar1 = &(this->AutogenTarget).ParseCacheFile;
      prefix_01._M_str = (char *)iVerb;
      prefix_01._M_len = local_c0;
      suffix_00._M_str = ".txt";
      suffix_00._M_len = 4;
      ConfigFileNames(this,pCVar1,prefix_01,suffix_00);
      std::__cxx11::string::~string((string *)&iVerb);
      ConfigFileClean(this,pCVar1);
      pcVar3 = this->GenTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&iVerb,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)&propInt);
      bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,(string *)&iVerb);
      (this->AutogenTarget).DependOrigin = bVar5;
      std::__cxx11::string::~string((string *)&iVerb);
      pcVar3 = this->GenTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&iVerb,"AUTOGEN_TARGET_DEPENDS",(allocator<char> *)&propInt);
      psVar15 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&iVerb);
      std::__cxx11::string::~string((string *)&iVerb);
      if (psVar15->_M_string_length != 0) {
        std::__cxx11::string::string((string *)&iVerb,(string *)psVar15);
        init._M_len = 1;
        init._M_array = (iterator)&iVerb;
        cmList::cmList((cmList *)&propInt,init);
        std::__cxx11::string::~string((string *)&iVerb);
        psVar15 = local_a0;
        for (psVar16 = (string *)propInt; psVar16 != psVar15; psVar16 = psVar16 + 1) {
          iVerb = (unsigned_long)cmMakefile::FindTargetToUse(this->Makefile,psVar16,false);
          if ((cmTarget *)iVerb == (cmTarget *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->AutogenTarget).DependFiles,psVar16);
          }
          else {
            std::
            _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
            ::_M_insert_unique<cmTarget*const&>
                      ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                        *)&(this->AutogenTarget).DependTargets,(cmTarget **)&iVerb);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&propInt);
      }
      if ((this->Moc).super_GenVarsT.Enabled == true) {
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&iVerb,"AUTOMOC_PATH_PREFIX",(allocator<char> *)&filterList);
        propInt = (unsigned_long)cmGeneratorTarget::GetProperty(pcVar3,(string *)&iVerb);
        bVar5 = cmValue::IsOn((cmValue *)&propInt);
        std::__cxx11::string::~string((string *)&iVerb);
        if (bVar5) {
          (this->Moc).PathPrefix = true;
        }
        pcVar2 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&iVerb,"CMAKE_AUTOMOC_RELAXED_MODE",(allocator<char> *)&propInt);
        bVar5 = cmMakefile::IsOn(pcVar2,(string *)&iVerb);
        std::__cxx11::string::~string((string *)&iVerb);
        if (bVar5) {
          (this->Moc).RelaxedMode = true;
          pcVar2 = this->Makefile;
          psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
          cmStrCat<char_const(&)[134],std::__cxx11::string_const&,char_const(&)[18]>
                    ((string *)&iVerb,
                     (char (*) [134])
                     "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  Consider disabling it and converting the target "
                     ,psVar15,(char (*) [18])" to regular mode.");
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&iVerb);
          std::__cxx11::string::~string((string *)&iVerb);
        }
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&iVerb,"AUTOMOC_MOC_OPTIONS",(allocator<char> *)&propInt);
        psVar15 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&iVerb);
        value_00._M_str = (psVar15->_M_dataplus)._M_p;
        value_00._M_len = psVar15->_M_string_length;
        cmList::append(&(this->Moc).Options,value_00,No);
        std::__cxx11::string::~string((string *)&iVerb);
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&iVerb,"AUTOMOC_MACRO_NAMES",(allocator<char> *)&propInt);
        psVar15 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&iVerb);
        container = &(this->Moc).MacroNames;
        value_01._M_str = (psVar15->_M_dataplus)._M_p;
        value_01._M_len = psVar15->_M_string_length;
        cmList::append(container,value_01,No);
        std::__cxx11::string::~string((string *)&iVerb);
        __first = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (container);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(container,(const_iterator)__first._M_current,
                (this->Moc).MacroNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&propInt,"AUTOMOC_DEPEND_FILTERS",&local_81);
        psVar15 = cmGeneratorTarget::GetSafeProperty(pcVar3,(string *)&propInt);
        std::__cxx11::string::string((string *)&iVerb,(string *)psVar15);
        init_00._M_len = 1;
        init_00._M_array = (iterator)&iVerb;
        cmList::cmList(&filterList,init_00);
        std::__cxx11::string::~string((string *)&iVerb);
        std::__cxx11::string::~string((string *)&propInt);
        uVar17 = (long)filterList.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 CONCAT71(filterList.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                          filterList.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_1_);
        if ((uVar17 & 0x20) == 0) {
          this_00 = &(this->Moc).DependFilters;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::reserve(this_00,((ulong)((long)uVar17 >> 5) >> 1) + 1);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<char_const(&)[18],char_const(&)[57]>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)this_00,(char (*) [18])"Q_PLUGIN_METADATA",
                     (char (*) [57])
                     "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\([^\\)]*FILE[ \t]*\"([^\"]+)\"");
          lVar19 = 0;
          for (lVar18 = 0;
              lVar4 = CONCAT71(filterList.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               filterList.Values.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_),
              lVar18 != (long)filterList.Values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar4 >> 5;
              lVar18 = lVar18 + 2) {
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar4 + lVar19),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar4 + lVar19 + 0x20));
            lVar19 = lVar19 + 0x40;
          }
        }
        else {
          propInt = (long)uVar17 >> 5;
          cmStrCat<char_const(&)[46],unsigned_long,char_const(&)[25]>
                    ((string *)&iVerb,(char (*) [46])"AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size "
                     ,&propInt,(char (*) [25])" is not a multiple of 2.");
          cmSystemTools::Error((string *)&iVerb);
          std::__cxx11::string::~string((string *)&iVerb);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&filterList.Values);
        if ((uVar17 & 0x20) != 0) goto LAB_002ad335;
      }
      goto LAB_002ad1c9;
    }
    bVar5 = InitMoc(this);
    if (bVar5) {
      bVar6 = (this->Uic).super_GenVarsT.Enabled;
      goto LAB_002acbc5;
    }
  }
LAB_002ad335:
  bVar5 = false;
LAB_002ad337:
  std::__cxx11::string::~string((string *)&relativeBuildDir);
  return bVar5;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  // Configurations
  this->MultiConfig = this->GlobalGen->IsMultiConfig();
  this->ConfigDefault = this->Makefile->GetDefaultConfiguration();
  this->ConfigsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Verbosity
  {
    std::string const def =
      this->Makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
    if (!def.empty()) {
      unsigned long iVerb = 0;
      if (cmStrToULong(def, &iVerb)) {
        // Numeric verbosity
        this->Verbosity = static_cast<unsigned int>(iVerb);
      } else {
        // Non numeric verbosity
        if (cmIsOn(def)) {
          this->Verbosity = 1;
        }
      }
    }
  }

  // Targets FOLDER
  {
    cmValue folder =
      this->Makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!folder) {
      folder = this->Makefile->GetState()->GetGlobalProperty(
        "AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (!folder) {
      folder = this->GenTarget->GetProperty("FOLDER");
    }
    if (folder) {
      this->TargetsFolder = *folder;
    }
  }

  // Check status of policy CMP0071 regarding handling of GENERATED files
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0071)) {
    case cmPolicies::WARN:
      // Ignore GENERATED files but warn
      this->CMP0071Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore GENERATED files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process GENERATED files
      this->CMP0071Accept = true;
      break;
  }

  // Check status of policy CMP0100 regarding handling of .hh headers
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0100)) {
    case cmPolicies::WARN:
      // Ignore but .hh files but warn
      this->CMP0100Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore .hh files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process .hh file
      this->CMP0100Accept = true;
      break;
  }

  // Common directories
  std::string relativeBuildDir;
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), this->Makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cmStrCat(cbd, "/CMakeFiles/", this->GenTarget->GetName(),
                              "_autogen.dir");
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->GenTarget->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build =
        cmStrCat(cbd, '/', this->GenTarget->GetName(), "_autogen");
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    this->Dir.RelativeBuild =
      cmSystemTools::RelativePath(cbd, this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->ConfigFileNamesAndGenex(this->Dir.Include, this->Dir.IncludeGenExp,
                                  cmStrCat(this->Dir.Build, "/include"), "");
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !this->InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !this->InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name =
      cmStrCat(this->GenTarget->GetName(), "_autogen");

    // Autogen target parallel processing
    {
      using ParallelType = decltype(this->AutogenTarget.Parallel);
      unsigned long propInt = 0;
      std::string const& prop =
        this->GenTarget->GetSafeProperty("AUTOGEN_PARALLEL");
      if (prop.empty() || (prop == "AUTO")) {
        // Autodetect number of CPUs
        this->AutogenTarget.Parallel = GetParallelCPUCount();
      } else if (cmStrToULong(prop, &propInt) && propInt > 0 &&
                 propInt <= std::numeric_limits<ParallelType>::max()) {
        this->AutogenTarget.Parallel = static_cast<ParallelType>(propInt);
      } else {
        // Warn the project author that AUTOGEN_PARALLEL is not valid.
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOGEN_PARALLEL=\"", prop, "\" for target \"",
                   this->GenTarget->GetName(),
                   "\" is not valid. Using AUTOGEN_PARALLEL=1"));
        this->AutogenTarget.Parallel = 1;
      }
    }

#ifdef _WIN32
    {
      const auto& value =
        this->GenTarget->GetProperty("AUTOGEN_COMMAND_LINE_LENGTH_MAX");
      if (value.IsSet()) {
        using maxCommandLineLengthType =
          decltype(this->AutogenTarget.MaxCommandLineLength);
        unsigned long propInt = 0;
        if (cmStrToULong(value, &propInt) && propInt > 0 &&
            propInt <= std::numeric_limits<maxCommandLineLengthType>::max()) {
          this->AutogenTarget.MaxCommandLineLength =
            static_cast<maxCommandLineLengthType>(propInt);
        } else {
          // Warn the project author that AUTOGEN_PARALLEL is not valid.
          this->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("AUTOGEN_COMMAND_LINE_LENGTH_MAX=\"", *value,
                     "\" for target \"", this->GenTarget->GetName(),
                     "\" is not valid. Using no limit for "
                     "AUTOGEN_COMMAND_LINE_LENGTH_MAX"));
          this->AutogenTarget.MaxCommandLineLength =
            std::numeric_limits<maxCommandLineLengthType>::max();
        }
      } else {
        // Actually 32767 (see
        // https://devblogs.microsoft.com/oldnewthing/20031210-00/?p=41553) but
        // we allow for a small margin
        this->AutogenTarget.MaxCommandLineLength = 32000;
      }
    }
#endif

    // Autogen target info and settings files
    {
      // Info file
      this->AutogenTarget.InfoFile =
        cmStrCat(this->Dir.Info, "/AutogenInfo.json");

      // Used settings file
      this->ConfigFileNames(this->AutogenTarget.SettingsFile,
                            cmStrCat(this->Dir.Info, "/AutogenUsed"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.SettingsFile);

      // Parse cache file
      this->ConfigFileNames(this->AutogenTarget.ParseCacheFile,
                            cmStrCat(this->Dir.Info, "/ParseCache"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->GenTarget->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const& deps =
        this->GenTarget->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        for (auto const& depName : cmList{ deps }) {
          // Allow target and file dependencies
          auto* depTarget = this->Makefile->FindTargetToUse(depName);
          if (depTarget) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    if (this->Moc.Enabled) {
      // Path prefix
      if (this->GenTarget->GetProperty("AUTOMOC_PATH_PREFIX").IsOn()) {
        this->Moc.PathPrefix = true;
      }

      // CMAKE_AUTOMOC_RELAXED_MODE
      if (this->Makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE")) {
        this->Moc.RelaxedMode = true;
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                   "deprecated an will be removed in the future.  Consider "
                   "disabling it and converting the target ",
                   this->GenTarget->GetName(), " to regular mode."));
      }

      // Options
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MOC_OPTIONS"),
                   this->Moc.Options);
      // Filters
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MACRO_NAMES"),
                   this->Moc.MacroNames);
      this->Moc.MacroNames.erase(cmRemoveDuplicates(this->Moc.MacroNames),
                                 this->Moc.MacroNames.end());
      {
        cmList const filterList = { this->GenTarget->GetSafeProperty(
          "AUTOMOC_DEPEND_FILTERS") };
        if ((filterList.size() % 2) != 0) {
          cmSystemTools::Error(
            cmStrCat("AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ",
                     filterList.size(), " is not a multiple of 2."));
          return false;
        }
        this->Moc.DependFilters.reserve(1 + (filterList.size() / 2));
        this->Moc.DependFilters.emplace_back(
          "Q_PLUGIN_METADATA",
          "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\("
          "[^\\)]*FILE[ \t]*\"([^\"]+)\"");
        for (cmList::size_type ii = 0; ii != filterList.size(); ii += 2) {
          this->Moc.DependFilters.emplace_back(filterList[ii],
                                               filterList[ii + 1]);
        }
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !this->InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    auto addBefore = false;
    auto const& value =
      this->GenTarget->GetProperty("AUTOGEN_USE_SYSTEM_INCLUDE");
    if (value.IsSet()) {
      if (value.IsOn()) {
        this->GenTarget->AddSystemIncludeDirectory(this->Dir.IncludeGenExp,
                                                   "CXX");
      } else {
        addBefore = true;
      }
    } else {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0151)) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          addBefore = true;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          this->GenTarget->AddSystemIncludeDirectory(this->Dir.IncludeGenExp,
                                                     "CXX");
          break;
      }
    }
    this->GenTarget->AddIncludeDirectory(this->Dir.IncludeGenExp, addBefore);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}